

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
::val(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
      *this)

{
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar3;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).left_;
  return ((this->right_->fadexpr_).left_)->val_ * ((this->right_->fadexpr_).right_)->val_ +
         ((pFVar2->fadexpr_).left_)->val_ * ((pFVar2->fadexpr_).right_)->val_ +
         (((pFVar3->fadexpr_).left_)->val_ - ((pFVar3->fadexpr_).right_)->val_) *
         ((pFVar1->fadexpr_).right_)->val_;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}